

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVector<llvm::DWARFDebugLoc::Entry,_2U>::~SmallVector
          (SmallVector<llvm::DWARFDebugLoc::Entry,_2U> *this)

{
  undefined1 *__ptr;
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  
  uVar1 = (ulong)(this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
                 super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar1 != 0) {
    pvVar2 = (void *)((long)(this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
                            super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                            super_SmallVectorBase.BeginX + uVar1 * 0x28 + -8);
    lVar3 = uVar1 * -0x28;
    do {
      if (pvVar2 != *(void **)((long)pvVar2 + -0x10)) {
        free(*(void **)((long)pvVar2 + -0x10));
      }
      pvVar2 = (void *)((long)pvVar2 + -0x28);
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0);
  }
  __ptr = (undefined1 *)
          (this->super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>).
          super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
          BeginX;
  if ((SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U> *)__ptr !=
      &this->super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }